

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O0

void __thiscall
dlib::bsp_context::bsp_context(bsp_context *this,unsigned_long node_id_,map_id_to_con *cons_)

{
  byte bVar1;
  _func_void_bsp_con_ptr_unsigned_long_unsigned_long_thread_safe_message_queue_ptr *funct;
  bsp_con *arg1;
  unsigned_long arg2;
  long *arg3;
  undefined8 *puVar2;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *in_stack_00000008;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_00000010;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> ptr;
  thread_safe_message_queue *in_stack_ffffffffffffff58;
  unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
  *in_stack_ffffffffffffff60;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff70;
  thread_safe_message_queue *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffa8;
  reference_wrapper<dlib::impl1::thread_safe_message_queue> arg4;
  undefined8 local_18;
  undefined8 local_10;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 1;
  arg4.obj = (thread_safe_message_queue *)(in_RDI + 4);
  local_18 = in_RDX;
  local_10 = in_RSI;
  impl1::thread_safe_message_queue::thread_safe_message_queue(in_stack_ffffffffffffff80);
  in_RDI[0x17] = local_18;
  in_RDI[0x18] = local_10;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::array(in_stack_ffffffffffffff70);
  (**(code **)(*(long *)in_RDI[0x17] + 0x18))();
  while( true ) {
    bVar1 = (**(code **)(*(long *)in_RDI[0x17] + 0x38))();
    if ((bVar1 & 1) == 0) break;
    funct = (_func_void_bsp_con_ptr_unsigned_long_unsigned_long_thread_safe_message_queue_ptr *)
            operator_new(0x88);
    arg1 = (bsp_con *)(**(code **)(*(long *)in_RDI[0x17] + 0x30))();
    arg2 = (**(code **)&((arg1->con)._M_t.
                         super___uniq_ptr_impl<dlib::connection,_std::default_delete<dlib::connection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dlib::connection_*,_std::default_delete<dlib::connection>_>
                         .super__Head_base<0UL,_dlib::connection_*,_false>._M_head_impl)->field_0x20
           )();
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::get
              (in_stack_ffffffffffffff60);
    arg3 = (long *)(**(code **)(*(long *)in_RDI[0x17] + 0x30))();
    puVar2 = (undefined8 *)(**(code **)(*arg3 + 0x10))();
    in_stack_ffffffffffffff60 =
         (unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *)*puVar2;
    ref<dlib::impl1::thread_safe_message_queue>(in_stack_ffffffffffffff58);
    thread_function::
    thread_function<void(*)(dlib::impl1::bsp_con*,unsigned_long,unsigned_long,dlib::impl1::thread_safe_message_queue&),dlib::impl1::bsp_con*,unsigned_long,unsigned_long,dlib::reference_wrapper<dlib::impl1::thread_safe_message_queue>>
              ((thread_function *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),funct,arg1,arg2,
               (unsigned_long)arg3,arg4);
    in_stack_ffffffffffffff58 = (thread_safe_message_queue *)&stack0xffffffffffffffd0;
    std::unique_ptr<dlib::thread_function,std::default_delete<dlib::thread_function>>::
    unique_ptr<std::default_delete<dlib::thread_function>,void>
              ((unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)
               in_stack_ffffffffffffff60,(pointer)in_stack_ffffffffffffff58);
    array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::push_back(in_stack_00000010,in_stack_00000008);
    std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>::~unique_ptr
              ((unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)
               in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

bsp_context::
    bsp_context(
        unsigned long node_id_,
        impl1::map_id_to_con& cons_
    ) :
        outstanding_messages(0),
        num_waiting_nodes(0),
        num_terminated_nodes(0),
        current_epoch(1),
        _cons(cons_),
        _node_id(node_id_)
    {
        // spawn a bunch of read threads, one for each connection
        _cons.reset();
        while (_cons.move_next())
        {
            std::unique_ptr<thread_function> ptr(new thread_function(&impl2::read_thread,
                                                                _cons.element().value().get(),
                                                                _node_id,
                                                                _cons.element().key(),
                                                                ref(msg_buffer)));
            threads.push_back(ptr);
        }

    }